

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputBlock(Node *this,ostream *os)

{
  ostream *poVar1;
  Node *this_00;
  string sStack_48;
  
  Indent_abi_cxx11_(&sStack_48,this);
  poVar1 = std::operator<<(os,(string *)&sStack_48);
  poVar1 = std::operator<<(poVar1,"{");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_48);
  Level = Level + 1;
  for (this_00 = this; this_00 != (Node *)0x0; this_00 = this_00->Block[0]) {
    if ((this_00->FromInclude == 0) || (CompileFlag != 0)) {
      OutputCodeOne(this_00,os);
    }
  }
  Level = Level + -1;
  Indent_abi_cxx11_(&sStack_48,this);
  poVar1 = std::operator<<(os,(string *)&sStack_48);
  poVar1 = std::operator<<(poVar1,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void Node::OutputBlock(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	//
	// If this is a 0 bit of code, just output a semicolon
	//
	if (this == 0)
	{
		os << Indent() << ";" << std::endl;
	}
	else
	{
		//
		// Start the block
		//
		os << Indent() << "{" << std::endl;

		Level++;

		//
		// Local Variables
		//
		Node *Program = this;

		//
		// Starting at the top node, we scan down handling each
		// level 0 node type as necessary.
		//
		// Could do this by calling OutputCode recursively for the Down
		// level instead of splitting into OutputCode and OutputCodeOne,
		// but that would probibly consume too much stack space.
		//
		while (Program != 0)
		{
			//
			// Handle Statement
			//
			if ((Program->FromInclude == 0) || (CompileFlag != 0))
			{
				Program->OutputCodeOne(os);
			}

			//
			// Get next node
			//
			Program = Program->Block[0];
		}

		//
		// End the block
		//
		Level--;
		os << Indent() << "}" << std::endl;
	}
}